

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int stbtt_GetNumberOfFonts(uchar *data)

{
  int iVar1;
  uchar *in_RDI;
  
  iVar1 = stbtt_GetNumberOfFonts_internal(in_RDI);
  return iVar1;
}

Assistant:

STBTT_DEF int stbtt_GetNumberOfFonts(const unsigned char *data)
{
return stbtt_GetNumberOfFonts_internal((unsigned char *) data);
}